

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibIO.cpp
# Opt level: O2

void lib::io::ReadByFormat(StackAPI *api,FILE *file,string *format)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long __off;
  long lVar4;
  char *pcVar5;
  size_t len;
  pointer pcVar6;
  pointer len_00;
  pointer len_01;
  size_type __n;
  allocator_type local_49;
  double num;
  pointer local_40;
  
  bVar2 = std::operator==(format,"*n");
  if (bVar2) {
    num = 0.0;
    iVar3 = __isoc99_fscanf(file,"%lg");
    if (iVar3 == 1) {
      luna::StackAPI::PushNumber(api,num);
    }
    else {
      luna::StackAPI::PushNil(api);
    }
  }
  else {
    bVar2 = std::operator==(format,"*a");
    if (bVar2) {
      __off = ftell((FILE *)file);
      fseek((FILE *)file,0,2);
      lVar4 = ftell((FILE *)file);
      fseek((FILE *)file,__off,0);
      __n = lVar4 - __off;
      if (__n == 0) {
        luna::StackAPI::PushString(api,"");
        return;
      }
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&num,__n,&local_49);
      len = fread((void *)num,1,__n,(FILE *)file);
      luna::StackAPI::PushString(api,(char *)num,len);
    }
    else {
      bVar2 = std::operator==(format,"*l");
      if ((!bVar2) && (bVar2 = std::operator==(format,"*L"), !bVar2)) {
        luna::StackAPI::PushNil(api);
        return;
      }
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&num,0x81,&local_49);
      len_00 = (pointer)0x0;
      while (pcVar5 = fgets(len_00 + (long)num,0x81,(FILE *)file), pcVar5 != (char *)0x0) {
        pcVar1 = local_40 + (-1 - (long)num);
        pcVar6 = pcVar1;
        if (pcVar1 < len_00) {
          pcVar6 = len_00;
        }
        for (; ((len_01 = pcVar6, len_00 < pcVar1 && (len_01 = len_00, len_00[(long)num] != '\0'))
               && (len_00[(long)num] != '\n')); len_00 = len_00 + 1) {
        }
        if (len_01 != pcVar1) {
          if (len_01[(long)num] == '\n') {
            bVar2 = std::operator==(format,"*L");
            len_01 = len_01 + bVar2;
          }
          luna::StackAPI::PushString(api,(char *)num,(size_t)len_01);
          goto LAB_001284bf;
        }
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)&num,
                   (size_type)(local_40 + (0x80 - (long)num)));
        len_00 = pcVar1;
      }
      if (len_00 == (pointer)0x0) {
        luna::StackAPI::PushNil(api);
      }
      else {
        luna::StackAPI::PushString(api,(char *)num,(size_t)len_00);
      }
    }
LAB_001284bf:
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&num);
  }
  return;
}

Assistant:

void ReadByFormat(luna::StackAPI &api, std::FILE *file,
                      const std::string format)
    {
        if (format == "*n")
        {
            // Read a number
            double num = 0.0;
            if (std::fscanf(file, "%lg", &num) == 1)
                api.PushNumber(num);
            else
                api.PushNil();
        }
        else if (format == "*a")
        {
            // Read total content of file
            auto cur = std::ftell(file);
            std::fseek(file, 0, SEEK_END);
            auto bytes = std::ftell(file) - cur;
            std::fseek(file, cur, SEEK_SET);
            if (bytes == 0)
                api.PushString("");
            else
            {
                std::vector<char> buf(bytes);
                bytes = std::fread(&buf[0], sizeof(buf[0]), bytes, file);
                api.PushString(&buf[0], bytes);
            }
        }
        else if (format == "*l" || format == "*L")
        {
            // Read line
            const std::size_t part = 128;
            const std::size_t part_count = part + 1;

            std::size_t count = 0;
            std::vector<char> buf(part_count);
            do
            {
                if (!std::fgets(&buf[count], part_count, file))
                {
                    // EOF or an error occured
                    // if count is 0, push a nil as end of file
                    // otherwise, push the buf as string
                    if (count == 0)
                        api.PushNil();
                    else
                        api.PushString(&buf[0], count);
                    break;
                }
                else
                {
                    auto size = buf.size();
                    while (count < size - 1 &&
                            buf[count] != '\n' && buf[count] != '\0')
                        ++count;
                    // buf[size - 1] must be '\0'
                    if (count == size - 1)
                    {
                        // '\n' is not exist, extend buf to continue read
                        buf.resize(size + part);
                    }
                    else
                    {
                        // If buf[count] is '\n', keep '\n' when
                        // format is "*L"
                        if (buf[count] == '\n' && format == "*L") ++count;
                        api.PushString(&buf[0], count);
                        break;
                    }
                }
            } while (true);
        }
        else
            api.PushNil();
    }